

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jas_icc.c
# Opt level: O3

int jas_iccputuint(jas_stream_t *out,int n,unsigned_long_long val)

{
  uchar *puVar1;
  int iVar2;
  ulong uVar3;
  long lVar4;
  long lVar5;
  
  if (0 < n) {
    lVar4 = (ulong)(uint)n * 8 + 0xfffffff8;
    lVar5 = (ulong)(uint)n + 1;
    do {
      uVar3 = val >> ((byte)lVar4 & 0x3f);
      if ((out->flags_ & 7U) != 0) {
        return -1;
      }
      if ((-1 < out->rwlimit_) && (out->rwlimit_ <= out->rwcnt_)) {
        out->flags_ = out->flags_ | 4;
        return -1;
      }
      *(byte *)&out->bufmode_ = (byte)out->bufmode_ | 0x20;
      iVar2 = out->cnt_;
      out->cnt_ = iVar2 + -1;
      if (iVar2 < 1) {
        iVar2 = jas_stream_flushbuf(out,(uint)uVar3 & 0xff);
        if (iVar2 == -1) {
          return -1;
        }
      }
      else {
        out->rwcnt_ = out->rwcnt_ + 1;
        puVar1 = out->ptr_;
        out->ptr_ = puVar1 + 1;
        *puVar1 = (uchar)uVar3;
      }
      lVar4 = lVar4 + -8;
      lVar5 = lVar5 + -1;
    } while (1 < lVar5);
  }
  return 0;
}

Assistant:

static int jas_iccputuint(jas_stream_t *out, int n, jas_ulonglong val)
{
	int i;
	int c;
	for (i = n; i > 0; --i) {
		c = (val >> (8 * (i - 1))) & 0xff;
		if (jas_stream_putc(out, c) == EOF)
			return -1;
	}
	return 0;
}